

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdNode * cuddUniqueInter(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int *piVar4;
  void *pvVar5;
  DdSubtable *pDVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  DdNode **ppDVar10;
  DdSubtable *pDVar11;
  DdSubtable *pDVar12;
  DdSubtable *__ptr;
  DdSubtable *__ptr_00;
  unsigned_long uVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  int iVar16;
  DdNode *pDVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  DdNode **ppDVar25;
  long lVar26;
  size_t __size;
  long local_98;
  DdSubtable *local_50;
  
  uVar3 = unique->size;
  if ((int)uVar3 <= index) {
    lVar9 = (long)(int)uVar3;
    iVar8 = unique->maxSize;
    uVar22 = unique->initSlots;
    lVar26 = (long)(int)uVar22;
    if (iVar8 <= index) {
      iVar16 = index + 10;
      lVar24 = (long)iVar16;
      pDVar11 = (DdSubtable *)malloc(lVar24 * 0x38);
      if (pDVar11 == (DdSubtable *)0x0) goto LAB_00661dc8;
      pDVar12 = (DdSubtable *)malloc(lVar24 * 8);
      if (pDVar12 != (DdSubtable *)0x0) {
        __size = lVar24 << 2;
        __ptr = (DdSubtable *)malloc(__size);
        if (__ptr == (DdSubtable *)0x0) {
          free(pDVar11);
          pDVar11 = pDVar12;
        }
        else {
          __ptr_00 = (DdSubtable *)malloc(__size);
          if (__ptr_00 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              uVar13 = unique->memused;
              lVar24 = (long)(iVar16 - iVar8);
              local_50 = (DdSubtable *)0x0;
            }
            else {
              local_50 = (DdSubtable *)malloc(__size);
              if (local_50 == (DdSubtable *)0x0) {
                free(pDVar11);
                free(pDVar12);
                free(__ptr);
                pDVar11 = __ptr_00;
                goto LAB_00661dc3;
              }
              lVar24 = (long)(iVar16 - iVar8);
              uVar13 = lVar24 * 4 + unique->memused;
            }
            unique->memused = (lVar26 * 8 + 0x48) * lVar24 + uVar13;
            if (unique->maxSizeZ < iVar16) {
              free(unique->stack);
              ppDVar10 = (DdNode **)malloc((long)index * 8 + 0x58);
              unique->stack = ppDVar10;
              if (ppDVar10 == (DdNode **)0x0) {
                free(pDVar11);
                free(pDVar12);
                free(__ptr);
                free(__ptr_00);
                if ((local_50 == (DdSubtable *)0x0) ||
                   (pDVar11 = local_50, unique->map == (int *)0x0)) goto LAB_00661dc8;
                goto LAB_00661dc3;
              }
              *ppDVar10 = (DdNode *)0x0;
              iVar8 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar8 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar16 - iVar8) * 8;
            }
            lVar24 = 0;
            uVar20 = 0;
            if (0 < (int)uVar3) {
              uVar20 = (ulong)uVar3;
            }
            for (lVar19 = 0; uVar20 * 4 - lVar19 != 0; lVar19 = lVar19 + 4) {
              pDVar6 = unique->subtables;
              puVar1 = (undefined8 *)((long)&pDVar6->shift + lVar24);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar11->shift + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              *(undefined4 *)((long)&pDVar11->dead + lVar24) =
                   *(undefined4 *)((long)&pDVar6->dead + lVar24);
              *(undefined8 *)((long)&pDVar11->nodelist + lVar24) =
                   *(undefined8 *)((long)&pDVar6->nodelist + lVar24);
              puVar1 = (undefined8 *)((long)&pDVar6->bindVar + lVar24);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pDVar11->bindVar + lVar24);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              *(undefined4 *)((long)&pDVar11->varToBeGrouped + lVar24) =
                   *(undefined4 *)((long)&pDVar6->varToBeGrouped + lVar24);
              *(undefined8 *)((long)&pDVar12->nodelist + lVar19 * 2) =
                   *(undefined8 *)((long)unique->vars + lVar19 * 2);
              *(undefined4 *)((long)&__ptr->nodelist + lVar19) =
                   *(undefined4 *)((long)unique->perm + lVar19);
              *(undefined4 *)((long)&__ptr_00->nodelist + lVar19) =
                   *(undefined4 *)((long)unique->invperm + lVar19);
              lVar24 = lVar24 + 0x38;
            }
            uVar21 = 0;
            lVar24 = lVar9;
            if (0 < (int)uVar22) {
              uVar21 = (ulong)uVar22;
            }
            for (; lVar24 <= index; lVar24 = lVar24 + 1) {
              pDVar11[lVar24].slots = uVar22;
              iVar8 = cuddComputeFloorLog2(uVar22);
              pDVar11[lVar24].shift = 0x20 - iVar8;
              pDVar11[lVar24].keys = 0;
              pDVar11[lVar24].maxKeys = uVar22 * 4;
              pDVar11[lVar24].dead = 0;
              pDVar11[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
              pDVar6 = pDVar11 + lVar24;
              pDVar6->bindVar = 0;
              pDVar6->varType = CUDD_VAR_PRIMARY_INPUT;
              *(undefined8 *)(&pDVar6->bindVar + 2) = 0;
              *(int *)((long)&__ptr->nodelist + lVar24 * 4) = (int)lVar24;
              *(int *)((long)&__ptr_00->nodelist + lVar24 * 4) = (int)lVar24;
              ppDVar10 = (DdNode **)malloc(lVar26 << 3);
              pDVar11[lVar24].nodelist = ppDVar10;
              if (ppDVar10 == (DdNode **)0x0) goto LAB_00661dc8;
              for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
                ppDVar10[uVar18] = &unique->sentinel;
              }
            }
            piVar4 = unique->map;
            if (piVar4 != (int *)0x0) {
              for (uVar21 = 0; lVar26 = lVar9, uVar20 != uVar21; uVar21 = uVar21 + 1) {
                *(int *)((long)&local_50->nodelist + uVar21 * 4) = piVar4[uVar21];
              }
              for (; lVar26 <= index; lVar26 = lVar26 + 1) {
                *(int *)((long)&local_50->nodelist + lVar26 * 4) = (int)lVar26;
              }
              free(piVar4);
              unique->map = (int *)local_50;
            }
            free(unique->subtables);
            unique->subtables = pDVar11;
            unique->maxSize = iVar16;
            free(unique->vars);
            unique->vars = (DdNode **)pDVar12;
            free(unique->perm);
            unique->perm = (int *)__ptr;
            free(unique->invperm);
            unique->invperm = (int *)__ptr_00;
            goto LAB_00661c21;
          }
          free(pDVar11);
          free(pDVar12);
          pDVar11 = __ptr;
        }
      }
LAB_00661dc3:
      free(pDVar11);
LAB_00661dc8:
      unique->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    uVar20 = 0;
    if (0 < (int)uVar22) {
      uVar20 = (ulong)uVar22;
    }
    for (lVar24 = lVar9; lVar24 <= index; lVar24 = lVar24 + 1) {
      unique->subtables[lVar24].slots = uVar22;
      iVar8 = cuddComputeFloorLog2(uVar22);
      pDVar11 = unique->subtables;
      pDVar11[lVar24].shift = 0x20 - iVar8;
      pDVar11[lVar24].keys = 0;
      pDVar11[lVar24].maxKeys = uVar22 * 4;
      pDVar11[lVar24].dead = 0;
      pDVar12 = pDVar11 + lVar24;
      pDVar12->bindVar = 0;
      pDVar12->varType = CUDD_VAR_PRIMARY_INPUT;
      *(undefined8 *)(&pDVar12->bindVar + 2) = 0;
      pDVar11[lVar24].varToBeGrouped = CUDD_LAZY_NONE;
      iVar8 = (int)lVar24;
      unique->perm[lVar24] = iVar8;
      unique->invperm[lVar24] = iVar8;
      ppDVar10 = (DdNode **)malloc(lVar26 << 3);
      pDVar11[lVar24].nodelist = ppDVar10;
      if (ppDVar10 == (DdNode **)0x0) {
        lVar26 = lVar9 * 0x38;
        for (; lVar9 < iVar8; lVar9 = lVar9 + 1) {
          pvVar5 = *(void **)((long)&pDVar11->nodelist + lVar26);
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
            pDVar11 = unique->subtables;
            *(undefined8 *)((long)&pDVar11->nodelist + lVar26) = 0;
          }
          lVar26 = lVar26 + 0x38;
        }
        goto LAB_00661dc8;
      }
      for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
        ppDVar10[uVar21] = &unique->sentinel;
      }
    }
    piVar4 = unique->map;
    lVar26 = lVar9;
    if (piVar4 != (int *)0x0) {
      for (; lVar26 <= index; lVar26 = lVar26 + 1) {
        piVar4[lVar26] = (int)lVar26;
      }
    }
LAB_00661c21:
    local_98 = (long)index;
    pDVar14 = unique->one;
    unique->size = index + 1;
    iVar16 = uVar22 * ((index + 1) - uVar3);
    unique->slots = unique->slots + iVar16;
    ddFixLimits(unique);
    iVar8 = unique->autoDyn;
    unique->autoDyn = 0;
    lVar24 = lVar9 << 0x20;
    for (lVar26 = lVar9; lVar26 <= local_98; lVar26 = lVar26 + 1) {
      pDVar15 = cuddUniqueInter(unique,(int)lVar26,pDVar14,(DdNode *)((ulong)pDVar14 ^ 1));
      unique->vars[lVar26] = pDVar15;
      if (unique->vars[lVar26] == (DdNode *)0x0) {
        unique->autoDyn = iVar8;
        for (lVar26 = lVar9; lVar26 < lVar24 >> 0x20; lVar26 = lVar26 + 1) {
          Cudd_IterDerefBdd(unique,unique->vars[lVar26]);
          ppDVar10 = unique->vars;
          ppDVar10[lVar26]->next = unique->nextFree;
          unique->nextFree = ppDVar10[lVar26];
          ppDVar10[lVar26] = (DdNode *)0x0;
        }
        lVar26 = lVar9 * 0x38;
        for (; lVar9 <= local_98; lVar9 = lVar9 + 1) {
          pDVar11 = unique->subtables;
          pvVar5 = *(void **)((long)&pDVar11->nodelist + lVar26);
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
            pDVar11 = unique->subtables;
            *(undefined8 *)((long)&pDVar11->nodelist + lVar26) = 0;
          }
          *(undefined8 *)((long)&pDVar11->nodelist + lVar26) = 0;
          lVar26 = lVar26 + 0x38;
        }
        unique->size = uVar3;
        unique->slots = unique->slots - iVar16;
        ddFixLimits(unique);
        return (DdNode *)0x0;
      }
      piVar4 = (int *)(((ulong)unique->vars[lVar26] & 0xfffffffffffffffe) + 4);
      *piVar4 = *piVar4 + 1;
      lVar24 = lVar24 + 0x100000000;
    }
    unique->autoDyn = iVar8;
  }
  pDVar12 = unique->subtables;
  uVar3 = unique->perm[index];
  pDVar11 = pDVar12 + uVar3;
  uVar21 = (ulong)T & 0xfffffffffffffffe;
  uVar22 = (uint)T & 1;
  uVar20 = (ulong)E & 0xfffffffffffffffe;
  uVar23 = (uint)E & 1;
  ppDVar10 = pDVar12[uVar3].nodelist +
             (int)((uVar23 + *(int *)(uVar20 + 0x20) * 2 +
                   (uVar22 + *(int *)(uVar21 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                  ((byte)pDVar12[uVar3].shift & 0x1f));
  do {
    ppDVar25 = ppDVar10;
    pDVar14 = *ppDVar25;
    pDVar15 = (pDVar14->type).kids.T;
    ppDVar10 = &pDVar14->next;
  } while (T < pDVar15);
  while (pDVar15 == T) {
    pDVar15 = (pDVar14->type).kids.E;
    if (pDVar15 <= E) {
      if (pDVar15 == E) {
        if (pDVar14->ref == 0) {
          cuddReclaim(unique,pDVar14);
          return pDVar14;
        }
        return pDVar14;
      }
      break;
    }
    ppDVar25 = &pDVar14->next;
    pDVar15 = (pDVar14->next->type).kids.T;
    pDVar14 = pDVar14->next;
  }
  if ((unique->autoDyn != 0) &&
     (unique->nextDyn <= unique->keys - (unique->countDead & unique->dead))) {
    iVar8 = Cudd_ReduceHeap(unique,unique->autoMethod,10);
    if (iVar8 != 0) {
      return (DdNode *)0x0;
    }
    unique->reordered = 2;
    return (DdNode *)0x0;
  }
  if (pDVar11->keys <= pDVar11->maxKeys) goto LAB_00661840;
  if (unique->gcEnabled == 0) {
LAB_006617c6:
    cuddRehash(unique,uVar3);
  }
  else {
    if ((unique->dead <= unique->minDead) &&
       ((unique->dead <= unique->minDead >> 1 ||
        ((double)pDVar11->dead <= (double)pDVar11->keys * 0.95)))) goto LAB_006617c6;
    cuddGarbageCollect(unique,1);
  }
  ppDVar10 = pDVar11->nodelist +
             (int)((uVar23 + *(int *)(uVar20 + 0x20) * 2 +
                   (uVar22 + *(int *)(uVar21 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                  ((byte)pDVar11->shift & 0x1f));
  do {
    ppDVar25 = ppDVar10;
    pDVar14 = *ppDVar25;
    pDVar15 = (pDVar14->type).kids.T;
    ppDVar10 = &pDVar14->next;
  } while (T < pDVar15);
  while ((pDVar15 == T && (E < (pDVar14->type).kids.E))) {
    ppDVar25 = &pDVar14->next;
    pDVar15 = (pDVar14->next->type).kids.T;
    pDVar14 = pDVar14->next;
  }
LAB_00661840:
  iVar8 = unique->garbageCollections;
  pDVar14 = cuddAllocNode(unique);
  if (pDVar14 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  unique->keys = unique->keys + 1;
  pDVar11->keys = pDVar11->keys + 1;
  if (iVar8 != unique->garbageCollections) {
    ppDVar10 = pDVar11->nodelist +
               (int)((uVar23 + *(int *)(uVar20 + 0x20) * 2 +
                     (uVar22 + *(int *)(uVar21 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                    ((byte)pDVar11->shift & 0x1f));
    do {
      ppDVar25 = ppDVar10;
      pDVar15 = *ppDVar25;
      pDVar17 = (pDVar15->type).kids.T;
      ppDVar10 = &pDVar15->next;
    } while (T < pDVar17);
    while ((pDVar17 == T && (E < (pDVar15->type).kids.E))) {
      ppDVar25 = &pDVar15->next;
      pDVar17 = (pDVar15->next->type).kids.T;
      pDVar15 = pDVar15->next;
    }
  }
  pDVar14->index = index;
  (pDVar14->type).kids.T = T;
  (pDVar14->type).kids.E = E;
  pDVar14->next = *ppDVar25;
  *ppDVar25 = pDVar14;
  T->ref = T->ref + 1;
  *(int *)(uVar20 + 4) = *(int *)(uVar20 + 4) + 1;
  return pDVar14;
}

Assistant:

DdNode *
cuddUniqueInter(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdNodePtr *previousP;
    DdSubtable *subtable;
    int gcNumber;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->size) {
        if (!ddResizeTable(unique,index)) return(NULL);
    }

    level = unique->perm[index];
    subtable = &(unique->subtables[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddI(unique,T->index));
    assert(level < (unsigned) cuddI(unique,Cudd_Regular(E)->index));
#endif

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    previousP = &(nodelist[pos]);
    looking = *previousP;

    while (T < cuddT(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    while (T == cuddT(looking) && E < cuddE(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    if (T == cuddT(looking) && E == cuddE(looking)) {
        if (looking->ref == 0) {
            cuddReclaim(unique,looking);
        }
        return(looking);
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDyn &&
    unique->keys - (unique->dead & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_ReduceHeap(unique,unique->autoMethod,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled &&
            ((unique->dead > unique->minDead) ||
            ((unique->dead > unique->minDead / 2) &&
            (subtable->dead > subtable->keys * 0.95)))) { /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,(int)level);
        }
        /* Update pointer to insertion point. In the case of rehashing,
        ** the slot may have changed. In the case of garbage collection,
        ** the predecessor may have been dead. */
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking = *previousP;

        while (T < cuddT(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking) && E < cuddE(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }

    gcNumber = unique->garbageCollections;
    looking = cuddAllocNode(unique);
    if (looking == NULL) {
        return(NULL);
    }
    unique->keys++;
    subtable->keys++;

    if (gcNumber != unique->garbageCollections) {
        DdNode *looking2;
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking2 = *previousP;

        while (T < cuddT(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking2) && E < cuddE(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = *previousP;
    *previousP = looking;
    cuddSatInc(T->ref);         /* we know T is a regular pointer */
    cuddRef(E);

#ifdef DD_DEBUG
    cuddCheckCollisionOrdering(unique,level,pos);
#endif

//    assert( Cudd_Regular(T)->Id < 100000000 );
//    assert( Cudd_Regular(E)->Id < 100000000 );
    return(looking);

}